

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

void * nk_buffer_align(void *unaligned,nk_size align,nk_size *alignment,
                      nk_buffer_allocation_type type)

{
  nk_size nVar1;
  void *pvVar2;
  
  if (type == NK_BUFFER_BACK) {
    if (align != 0) {
      pvVar2 = (void *)(-align & (ulong)unaligned);
      nVar1 = (long)unaligned - (long)pvVar2;
      goto LAB_001267ff;
    }
  }
  else if (align != 0) {
    pvVar2 = (void *)(-align & (long)unaligned + (align - 1));
    nVar1 = (long)pvVar2 - (long)unaligned;
    goto LAB_001267ff;
  }
  nVar1 = 0;
  pvVar2 = unaligned;
LAB_001267ff:
  *alignment = nVar1;
  return pvVar2;
}

Assistant:

NK_LIB void*
nk_buffer_align(void *unaligned,
nk_size align, nk_size *alignment,
enum nk_buffer_allocation_type type)
{
void *memory = 0;
switch (type) {
default:
case NK_BUFFER_MAX:
case NK_BUFFER_FRONT:
if (align) {
memory = NK_ALIGN_PTR(unaligned, align);
*alignment = (nk_size)((nk_byte*)memory - (nk_byte*)unaligned);
} else {
memory = unaligned;
*alignment = 0;
}
break;
case NK_BUFFER_BACK:
if (align) {
memory = NK_ALIGN_PTR_BACK(unaligned, align);
*alignment = (nk_size)((nk_byte*)unaligned - (nk_byte*)memory);
} else {
memory = unaligned;
*alignment = 0;
}
break;
}
return memory;
}